

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O1

BignumCarry
mp_add_masked_into(BignumInt *w_out,size_t rw,mp_int *a,mp_int *b,BignumInt b_and,BignumInt b_xor,
                  BignumCarry carry)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  BignumInt BVar4;
  ulong uVar5;
  BignumInt BVar6;
  ulong uVar7;
  
  if (rw != 0) {
    uVar1 = a->nw;
    uVar2 = b->nw;
    uVar3 = 0;
    do {
      if (uVar3 < uVar1) {
        BVar4 = a->w[uVar3];
      }
      else {
        BVar4 = 0;
      }
      if (uVar3 < uVar2) {
        BVar6 = b->w[uVar3];
      }
      else {
        BVar6 = 0;
      }
      uVar7 = BVar6 & b_and ^ b_xor;
      uVar5 = BVar4 + carry;
      carry = (ulong)CARRY8(BVar4,carry) + (ulong)CARRY8(uVar5,uVar7);
      if (w_out != (BignumInt *)0x0) {
        w_out[uVar3] = uVar5 + uVar7;
      }
      uVar3 = uVar3 + 1;
    } while (rw != uVar3);
  }
  return carry;
}

Assistant:

static BignumCarry mp_add_masked_into(
    BignumInt *w_out, size_t rw, mp_int *a, mp_int *b,
    BignumInt b_and, BignumInt b_xor, BignumCarry carry)
{
    for (size_t i = 0; i < rw; i++) {
        BignumInt aword = mp_word(a, i), bword = mp_word(b, i), out;
        bword = (bword & b_and) ^ b_xor;
        BignumADC(out, carry, aword, bword, carry);
        if (w_out)
            w_out[i] = out;
    }
    return carry;
}